

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall FunctionValueAnalyser::visit(FunctionValueAnalyser *this,Function *func)

{
  Function *in_RSI;
  shared_ptr<BlockNode> *in_RDI;
  shared_ptr<BlockNode> *in_stack_ffffffffffffffd8;
  Context *in_stack_ffffffffffffffe8;
  
  *(undefined1 *)
   &(in_RDI->super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = 1;
  Function::getReturnType(in_RSI);
  std::optional<TypeName>::optional<const_TypeName_&,_true>
            ((optional<TypeName> *)in_RDI,(TypeName *)in_stack_ffffffffffffffd8);
  *(Context **)
   ((long)&(in_RDI->super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi + 4
   ) = in_stack_ffffffffffffffe8;
  Function::getArguments_abi_cxx11_(in_RSI);
  std::
  optional<std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>>
  ::operator=((optional<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>_>
               *)in_RSI,
              (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
               *)in_stack_ffffffffffffffe8);
  Function::getBodyPtr(in_RSI);
  std::shared_ptr<BlockNode>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  Function::getContext(in_RSI);
  std::optional<Context>::operator=((optional<Context> *)in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void FunctionValueAnalyser::visit(const Function& func)
{
  valid_ = true;
  returnType_ = func.getReturnType();
  arguments_ = func.getArguments();
  body_ = func.getBodyPtr();
  context_ = func.getContext();
}